

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

int uc_check_cpu_x86_load_seg_x86_64(CPUX86State *env,int seg_reg,int sel)

{
  target_ulong tVar1;
  uint uVar2;
  int mmu_idx;
  uint32_t uVar3;
  uint uVar4;
  target_ulong ptr;
  SegmentCache *pSStack_40;
  int index;
  SegmentCache *dt;
  int rpl;
  int dpl;
  int cpl;
  uint32_t e2;
  int selector;
  int sel_local;
  int seg_reg_local;
  CPUX86State *env_local;
  
  if (((env->cr[0] & 1) == 0) || ((env->eflags & 0x20000) != 0)) {
    env_local._4_4_ = 0;
  }
  else {
    uVar2 = env->hflags & 3;
    if ((sel & 0xfffcU) == 0) {
      if ((seg_reg == 2) && (((env->hflags & 0x8000) == 0 || (uVar2 == 3)))) {
        env_local._4_4_ = 0x15;
      }
      else {
        env_local._4_4_ = 0;
      }
    }
    else {
      if ((sel & 4U) == 0) {
        pSStack_40 = &env->gdt;
      }
      else {
        pSStack_40 = &env->ldt;
      }
      if (pSStack_40->limit < (sel & 0xfff8U) + 7) {
        env_local._4_4_ = 0x15;
      }
      else {
        tVar1 = pSStack_40->base;
        mmu_idx = cpu_mmu_index_kernel(env);
        uVar3 = cpu_ldl_mmuidx_ra_x86_64(env,tVar1 + (long)(int)(sel & 0xfff8U) + 4,mmu_idx,0);
        if ((uVar3 & 0x1000) == 0) {
          env_local._4_4_ = 0x15;
        }
        else {
          uVar4 = uVar3 >> 0xd & 3;
          if (seg_reg == 2) {
            if (((uVar3 & 0x800) != 0) || ((uVar3 & 0x200) == 0)) {
              return 0x15;
            }
            if (((sel & 3U) != uVar2) || (uVar4 != uVar2)) {
              return 0x15;
            }
          }
          else {
            if ((uVar3 & 0xa00) == 0x800) {
              return 0x15;
            }
            if ((((uVar3 & 0x800) == 0) || ((uVar3 & 0x400) == 0)) &&
               ((uVar4 < uVar2 || (uVar4 < (sel & 3U))))) {
              return 0x15;
            }
          }
          if ((uVar3 & 0x8000) == 0) {
            if (seg_reg == 2) {
              env_local._4_4_ = 0x15;
            }
            else {
              env_local._4_4_ = 0x15;
            }
          }
          else {
            env_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return env_local._4_4_;
}

Assistant:

int uc_check_cpu_x86_load_seg(CPUX86State *env, int seg_reg, int sel)
{
    int selector;
    uint32_t e2;
    int cpl, dpl, rpl;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    if (!(env->cr[0] & CR0_PE_MASK) || (env->eflags & VM_MASK)) {
        return 0;
    } else {
        selector = sel & 0xffff;
        cpl = env->hflags & HF_CPL_MASK;
        if ((selector & 0xfffc) == 0) {
            /* null selector case */
            if (seg_reg == R_SS
#ifdef TARGET_X86_64
                && (!(env->hflags & HF_CS64_MASK) || cpl == 3)
#endif
                ) {
                return UC_ERR_EXCEPTION;
            }
            return 0;
        } else {
            if (selector & 0x4) {
                dt = &env->ldt;
            } else {
                dt = &env->gdt;
            }
            index = selector & ~7;
            if ((index + 7) > dt->limit) {
                return UC_ERR_EXCEPTION;
            }
            ptr = dt->base + index;
            e2 = cpu_ldl_kernel(env, ptr + 4);

            if (!(e2 & DESC_S_MASK)) {
                return UC_ERR_EXCEPTION;
            }
            rpl = selector & 3;
            dpl = (e2 >> DESC_DPL_SHIFT) & 3;
            if (seg_reg == R_SS) {
                /* must be writable segment */
                if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                    return UC_ERR_EXCEPTION;
                }
                if (rpl != cpl || dpl != cpl) {
                    return UC_ERR_EXCEPTION;
                }
            } else {
                /* must be readable segment */
                if ((e2 & (DESC_CS_MASK | DESC_R_MASK)) == DESC_CS_MASK) {
                    return UC_ERR_EXCEPTION;
                }

                if (!(e2 & DESC_CS_MASK) || !(e2 & DESC_C_MASK)) {
                    /* if not conforming code, test rights */
                    if (dpl < cpl || dpl < rpl) {
                        return UC_ERR_EXCEPTION;
                    }
                }
            }

            if (!(e2 & DESC_P_MASK)) {
                if (seg_reg == R_SS) {
                    return UC_ERR_EXCEPTION;
                } else {
                    return UC_ERR_EXCEPTION;
                }
            }
        }
    }

    return 0;
}